

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppPrinter.cpp
# Opt level: O0

void __thiscall hdc::CppPrinter::visit(CppPrinter *this,MinusAssignmentExpression *expression)

{
  Expression *pEVar1;
  MinusAssignmentExpression *expression_local;
  CppPrinter *this_local;
  
  this->isExpression = true;
  std::operator<<((ostream *)&this->field_0x20,"(");
  pEVar1 = BinaryOperator::getLeft(&expression->super_BinaryOperator);
  (**(pEVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar1,this);
  std::operator<<((ostream *)&this->field_0x20," -= ");
  pEVar1 = BinaryOperator::getRight(&expression->super_BinaryOperator);
  (**(pEVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar1,this);
  std::operator<<((ostream *)&this->field_0x20,")");
  return;
}

Assistant:

void CppPrinter::visit(MinusAssignmentExpression* expression) {
    isExpression = true;

    output << "(";
    expression->getLeft()->accept(this);
    output << " -= ";
    expression->getRight()->accept(this);
    output << ")";
}